

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O3

int archive_write_disk_set_standard_lookup(archive *a)

{
  int iVar1;
  void *private_data;
  void *private_data_00;
  
  private_data = calloc(0x7f,0x10);
  private_data_00 = calloc(0x7f,0x10);
  if (private_data == (void *)0x0 || private_data_00 == (void *)0x0) {
    free(private_data);
    free(private_data_00);
    iVar1 = -0x1e;
  }
  else {
    archive_write_disk_set_group_lookup(a,private_data_00,lookup_gid,cleanup);
    archive_write_disk_set_user_lookup(a,private_data,lookup_uid,cleanup);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
archive_write_disk_set_standard_lookup(struct archive *a)
{
	struct bucket *ucache = calloc(cache_size, sizeof(struct bucket));
	struct bucket *gcache = calloc(cache_size, sizeof(struct bucket));
	if (ucache == NULL || gcache == NULL) {
		free(ucache);
		free(gcache);
		return (ARCHIVE_FATAL);
	}
	archive_write_disk_set_group_lookup(a, gcache, lookup_gid, cleanup);
	archive_write_disk_set_user_lookup(a, ucache, lookup_uid, cleanup);
	return (ARCHIVE_OK);
}